

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::init
          (MultipleBindingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  BindingRenderCase::init(&this->super_BindingRenderCase,ctx);
  local_190._0_8_ =
       ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Rendering ",10);
  std::ostream::operator<<(this_00,0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
  std::ostream::operator<<(this_00,0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," grid.\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Vertex positions:\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tbinding point: 1\n",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Vertex offsets:\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tbinding point: 2\n",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Vertex colors:\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tbinding point: 2\n",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Binding point 1:\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tbuffer object: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Binding point 2:\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tbuffer object: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tinstance divisor: ",0x13)
  ;
  std::ostream::operator<<(this_00,(uint)(this->m_spec).instanced);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tstride: ",9);
  std::ostream::operator<<(this_00,((this->m_spec).zeroStride ^ 1) << 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar1 = std::ios_base::~ios_base(local_118);
  return iVar1;
}

Assistant:

void MultipleBindingCase::init (void)
{
	BindingRenderCase::init();

	// log what we are trying to do

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering " << (int)GRID_SIZE << "x" << (int)GRID_SIZE << " grid.\n"
						<< "Vertex positions:\n"
						<< "	binding point: 1\n"
						<< "Vertex offsets:\n"
						<< "	binding point: 2\n"
						<< "Vertex colors:\n"
						<< "	binding point: 2\n"
						<< "Binding point 1:\n"
						<< "	buffer object: " << m_primitiveBuf << "\n"
						<< "Binding point 2:\n"
						<< "	buffer object: " << ((m_spec.aliasingBuffers) ? (m_primitiveBuf) : (m_colorOffsetBuf)) << "\n"
						<< "	instance divisor: " << ((m_spec.instanced) ? (1) : (0)) << "\n"
						<< "	stride: " << ((m_spec.zeroStride) ? (0) : (4*4*2)) << "\n"
						<< tcu::TestLog::EndMessage;
}